

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O0

void __thiscall
TPZCompElH1<pzshape::TPZShapeCube>::SideShapeFunction
          (TPZCompElH1<pzshape::TPZShapeCube> *this,int side,TPZVec<double> *point,
          TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  byte bVar1;
  int iVar2;
  TPZGeoNode *this_00;
  long *plVar3;
  int in_ESI;
  long *in_RDI;
  int conloc;
  int nodloc;
  TPZGeoEl *ref;
  int c;
  int n;
  TPZManVector<int,_27> order;
  TPZManVector<long,_27> id;
  int nn;
  int nc;
  undefined4 in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdbc;
  int in_stack_fffffffffffffdc0;
  uint in_stack_fffffffffffffdc4;
  TPZCompEl *in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  TPZConnect *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  int in_stack_fffffffffffffde4;
  int local_1cc;
  int local_1c8;
  TPZVec<int> local_1b8 [4];
  TPZVec<long> local_128 [7];
  int local_30;
  int local_2c;
  int local_c;
  
  local_c = in_ESI;
  local_2c = pztopology::TPZCube::NContainedSides(in_ESI);
  local_30 = pztopology::TPZCube::NSideNodes(local_c);
  TPZManVector<long,_27>::TPZManVector
            ((TPZManVector<long,_27> *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0)
             ,(int64_t)in_stack_fffffffffffffdd8);
  TPZManVector<int,_27>::TPZManVector
            ((TPZManVector<int,_27> *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
             (int64_t)in_stack_fffffffffffffdd8);
  TPZCompEl::Reference(in_stack_fffffffffffffdc8);
  for (local_1c8 = 0; local_1c8 < local_30; local_1c8 = local_1c8 + 1) {
    pztopology::TPZCube::SideNodeLocId(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
    this_00 = TPZGeoEl::NodePtr((TPZGeoEl *)
                                CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                                (int)((ulong)in_stack_fffffffffffffdc8 >> 0x20));
    iVar2 = TPZGeoNode::Id(this_00);
    plVar3 = TPZVec<long>::operator[](local_128,(long)local_1c8);
    *plVar3 = (long)iVar2;
  }
  for (local_1cc = local_30; local_1cc < local_2c; local_1cc = local_1cc + 1) {
    in_stack_fffffffffffffde4 =
         pztopology::TPZCube::ContainedSideLocId
                   (in_stack_fffffffffffffdd0,(int)((ulong)in_stack_fffffffffffffdc8 >> 0x20));
    in_stack_fffffffffffffdd8 =
         (TPZConnect *)(**(code **)(*in_RDI + 0xa8))(in_RDI,in_stack_fffffffffffffde4);
    bVar1 = TPZConnect::Order(in_stack_fffffffffffffdd8);
    in_stack_fffffffffffffdd4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffdd4);
    in_stack_fffffffffffffdc4 = (uint)bVar1;
    in_stack_fffffffffffffdc8 =
         (TPZCompEl *)TPZVec<int>::operator[](local_1b8,(long)(local_1cc - local_30));
    *(uint *)in_stack_fffffffffffffdc8 = in_stack_fffffffffffffdc4;
  }
  pzshape::TPZShapeCube::SideShape
            (in_stack_fffffffffffffde4,(TPZVec<double> *)in_stack_fffffffffffffdd8,
             (TPZVec<long> *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
             (TPZVec<int> *)in_stack_fffffffffffffdc8,
             (TPZFMatrix<double> *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             (TPZFMatrix<double> *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  TPZManVector<int,_27>::~TPZManVector
            ((TPZManVector<int,_27> *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0))
  ;
  TPZManVector<long,_27>::~TPZManVector
            ((TPZManVector<long,_27> *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0)
            );
  return;
}

Assistant:

void TPZCompElH1<TSHAPE>::SideShapeFunction(int side,TPZVec<REAL> &point,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
	
	int nc = TSHAPE::NContainedSides(side);
	int nn = TSHAPE::NSideNodes(side);
	TPZManVector<int64_t,27> id(nn);
	TPZManVector<int,27> order(nc-nn);
	int n,c;
	TPZGeoEl *ref = this->Reference();
	for (n=0;n<nn;n++){
		int nodloc = TSHAPE::SideNodeLocId(side,n);
		id [n] = ref->NodePtr(nodloc)->Id();
	}
	for (c=nn;c<nc;c++){
		int conloc = TSHAPE::ContainedSideLocId(side,c);
        order[c-nn] = this->Connect(conloc).Order();
	}
	TSHAPE::SideShape(side, point, id, order, phi, dphi);
}